

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_interpolation_14(void)

{
  run("nulls should interpolate as the empty string","I ({{&cannot}}) be seen!","{\"cannot\": null}"
      ,(char *)0x0,"I () be seen!");
  return;
}

Assistant:

static void
test_interpolation_14(void)
{
    run(
        "nulls should interpolate as the empty string",
        "I ({{&cannot}}) be seen!",
        "{\"cannot\": null}",
        NULL,
        "I () be seen!"
    );
}